

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateFlattenTo2DLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  ActivationLinear *pAVar3;
  bool bVar4;
  LayerUnion LVar5;
  LogMessage *other;
  long lVar6;
  long *plVar7;
  size_type *psVar8;
  Result *_result;
  string err;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  LogMessage local_60;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar4 = Result::good(__return_storage_ptr__);
  if (bVar4) {
    pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    if (bVar4) {
      validateOutputCount(__return_storage_ptr__,layer,1,1);
      bVar4 = Result::good(__return_storage_ptr__);
      if (bVar4) {
        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != paVar1) {
          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
        }
        if (bVar4) {
          if (layer->_oneof_case_[0] == 0x46a) {
            LVar5 = layer->layer_;
          }
          else {
            LVar5.flattento2d_ = Specification::FlattenTo2DLayerParams::default_instance();
          }
          if (0 < (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_) {
            if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
              google::protobuf::internal::LogMessage::LogMessage
                        (&local_60,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                         ,0x5c6);
              other = google::protobuf::internal::LogMessage::operator<<
                                (&local_60,"CHECK failed: (index) < (current_size_): ");
              google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_a0,other);
              google::protobuf::internal::LogMessage::~LogMessage(&local_60);
            }
            lVar6 = (long)*(int *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->
                                         elements[0] + 0x24);
            pAVar3 = ((LVar5.activation_)->NonlinearityType_).linear_;
            if ((SBORROW8((long)pAVar3,-lVar6) !=
                 (long)&(pAVar3->super_MessageLite)._vptr_MessageLite + lVar6 < 0) ||
               (lVar6 <= (long)pAVar3)) {
              std::operator+(&local_80,
                             "Value of axis must be in the range [-rank(tensor), rank(tensor)) for \'"
                             ,(layer->name_).ptr_);
              plVar7 = (long *)std::__cxx11::string::append((char *)&local_80);
              psVar8 = (size_type *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar8) {
                local_a0.field_2._M_allocated_capacity = *psVar8;
                local_a0.field_2._8_8_ = plVar7[3];
                local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
              }
              else {
                local_a0.field_2._M_allocated_capacity = *psVar8;
                local_a0._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_a0._M_string_length = plVar7[1];
              *plVar7 = (long)psVar8;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != &local_80.field_2) {
                operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1
                               );
              }
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p == &local_a0.field_2) {
                return __return_storage_ptr__;
              }
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
              return __return_storage_ptr__;
            }
          }
          Result::Result(__return_storage_ptr__);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateFlattenTo2DLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    const auto& params = layer.flattento2d();
    // axis should be in range [-inputRank : inputRank)
    if (layer.inputtensor_size() > 0) {
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < -rank || params.axis() >= rank) {
            const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)) for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return Result();
}